

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * addenv(cgi_env_block *block,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ap;
  char *added;
  int space;
  int n;
  char *fmt_local;
  cgi_env_block *block_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  __s = block->buf + block->len;
  iVar1 = 0x2000 - (block->len + 2);
  if (0 < iVar1) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x10;
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    iVar2 = vsnprintf(__s,(long)iVar1,fmt,&local_48);
    if (((0 < iVar2) && (iVar2 + 1 < iVar1)) && (block->nvars < 0x3e)) {
      iVar1 = block->nvars;
      block->nvars = iVar1 + 1;
      block->vars[iVar1] = __s;
      block->len = iVar2 + 1 + block->len;
    }
  }
  return __s;
}

Assistant:

static char *addenv(struct cgi_env_block *block, const char *fmt, ...) {
    int n, space;
    char *added = block->buf + block->len;
    va_list ap;

    /* Calculate how much space is left in the buffer */
    space = sizeof(block->buf) - (block->len + 2);
    if (space > 0) {
        /* Copy VARIABLE=VALUE\0 string into the free space */
        va_start(ap, fmt);
        n = vsnprintf(added, (size_t) space, fmt, ap);
        va_end(ap);

        /* Make sure we do not overflow buffer and the envp array */
        if (n > 0 && n + 1 < space &&
            block->nvars < (int) ARRAY_SIZE(block->vars) - 2) {
            /* Append a pointer to the added string into the envp array */
            block->vars[block->nvars++] = added;
            /* Bump up used length counter. Include \0 terminator */
            block->len += n + 1;
        }
    }

    return added;
}